

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::GetValueForType
          (GraphicsRobustAccessPass *this,uint64_t value,Integer *type)

{
  uint32_t type_id;
  ConstantManager *this_00;
  Constant *c;
  TypeManager *this_01;
  Instruction *pIVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  this_00 = IRContext::get_constant_mgr((this->super_Pass).context_);
  if (*(uint *)&(type->super_Type).field_0x24 < 0x41) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4c = (uint)value;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
    if (0x20 < *(uint *)&(type->super_Type).field_0x24) {
      local_4c = (uint)(value >> 0x20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
    }
    c = analysis::ConstantManager::GetConstant
                  (this_00,&type->super_Type,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    this_01 = IRContext::get_type_mgr((this->super_Pass).context_);
    type_id = analysis::TypeManager::GetTypeInstruction(this_01,&type->super_Type);
    pIVar1 = analysis::ConstantManager::GetDefiningInstruction
                       (this_00,c,type_id,(inst_iterator *)0x0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    return pIVar1;
  }
  __assert_fail("type->width() <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x24b,
                "opt::Instruction *spvtools::opt::GraphicsRobustAccessPass::GetValueForType(uint64_t, const analysis::Integer *)"
               );
}

Assistant:

opt::Instruction* opt::GraphicsRobustAccessPass::GetValueForType(
    uint64_t value, const analysis::Integer* type) {
  auto* mgr = context()->get_constant_mgr();
  assert(type->width() <= 64);
  std::vector<uint32_t> words;
  words.push_back(uint32_t(value));
  if (type->width() > 32) {
    words.push_back(uint32_t(value >> 32u));
  }
  const auto* constant = mgr->GetConstant(type, words);
  return mgr->GetDefiningInstruction(
      constant, context()->get_type_mgr()->GetTypeInstruction(type));
}